

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

string * __thiscall
cmLocalGenerator::GetIncludeFlags
          (string *__return_storage_ptr__,cmLocalGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includeDirs,cmGeneratorTarget *target,string *lang,string *config,bool forResponseFile)

{
  cmMakefile *pcVar1;
  byte bVar2;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JeremieA[P]CMake_Source_cmLocalGenerator_cxx:269:5)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JeremieA[P]CMake_Source_cmLocalGenerator_cxx:269:5)>
  __comp_00;
  pointer __last;
  bool bVar3;
  long lVar4;
  cmValue cVar5;
  cmValue cVar6;
  ostream *poVar7;
  pointer pbVar8;
  cmGeneratorTarget *this_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  string_view str;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar9;
  string_view source;
  string flags;
  string sep;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  ostringstream includeFlags;
  string local_2d8;
  char local_2b2;
  char local_2b1;
  cmLocalGenerator *local_2b0;
  string *local_2a8;
  undefined4 local_2a0;
  OutputFormat local_29c;
  undefined1 local_298 [32];
  string *local_278;
  string *local_270;
  string *local_268;
  cmGeneratorTarget *local_260;
  string *local_258;
  undefined1 local_250 [8];
  undefined1 auStack_248 [24];
  _Base_ptr local_230;
  size_t local_228;
  undefined8 local_220;
  char *local_218;
  undefined8 local_210;
  string local_208;
  string *local_1e8;
  string *local_1e0;
  string *local_1d8;
  string *local_1d0;
  string *local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_2b0 = this;
  local_2a8 = lang;
  local_268 = config;
  if (lang->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1c0,includeDirs);
    __last = local_1c0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar8 = local_1c0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_298._0_8_ = target;
    if (target != (cmGeneratorTarget *)0x0) {
      local_250 = (undefined1  [8])local_298;
      auStack_248._0_8_ = local_268;
      auStack_248._8_8_ = local_2a8;
      if (local_1c0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1c0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        lVar4 = (long)local_1c0.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_1c0.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
        std::
        _Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_1a8,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )local_1c0.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                            (lVar4 - (lVar4 + 1 >> 0x3f)) + 1 >> 1);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8._16_8_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          __comp_00._M_comp.config = (string *)auStack_248._0_8_;
          __comp_00._M_comp.target = (cmGeneratorTarget **)local_250;
          __comp_00._M_comp.lang = (string *)auStack_248._8_8_;
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<MoveSystemIncludesToEnd(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*)::__0>>
                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )pbVar8,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               )__last,__comp_00);
        }
        else {
          __comp._M_comp.config = (string *)auStack_248._0_8_;
          __comp._M_comp.target = (cmGeneratorTarget **)local_250;
          __comp._M_comp.lang = (string *)auStack_248._8_8_;
          std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string*,long,__gnu_cxx::__ops::_Iter_comp_iter<MoveSystemIncludesToEnd(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*)::__0>>
                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )pbVar8,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               )__last,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1a8._16_8_,local_1a8._8_8_,__comp);
        }
        std::
        _Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Temporary_buffer
                  ((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1a8);
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar1 = local_2b0->Makefile;
    local_250 = (undefined1  [8])0x13;
    auStack_248._0_8_ = "CMAKE_INCLUDE_FLAG_";
    auStack_248._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_230 = (_Base_ptr)(local_2a8->_M_dataplus)._M_p;
    auStack_248._16_8_ = local_2a8->_M_string_length;
    local_228 = 0;
    views._M_len = 2;
    views._M_array = (iterator)local_250;
    cmCatViews((string *)local_298,views);
    local_260 = target;
    local_1d8 = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_298);
    if ((cmGeneratorTarget *)local_298._0_8_ != (cmGeneratorTarget *)(local_298 + 0x10)) {
      operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
    }
    pcVar1 = local_2b0->Makefile;
    local_250 = (undefined1  [8])(auStack_248 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_250,"CMAKE_QUOTE_INCLUDE_PATHS","");
    local_258 = (string *)cmMakefile::GetDefinition(pcVar1,(string *)local_250);
    if (local_250 != (undefined1  [8])(auStack_248 + 8)) {
      operator_delete((void *)local_250,(ulong)(auStack_248._8_8_ + 1));
    }
    local_298._0_8_ = (cmGeneratorTarget *)(local_298 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_298," ","");
    pcVar1 = local_2b0->Makefile;
    local_250 = (undefined1  [8])0x17;
    auStack_248._0_8_ = "CMAKE_INCLUDE_FLAG_SEP_";
    auStack_248._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_230 = (_Base_ptr)(local_2a8->_M_dataplus)._M_p;
    auStack_248._16_8_ = local_2a8->_M_string_length;
    local_228 = 0;
    views_00._M_len = 2;
    views_00._M_array = (iterator)local_250;
    cmCatViews(&local_2d8,views_00);
    this_00 = local_260;
    local_1d0 = (string *)cmMakefile::GetDefinition(pcVar1,&local_2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if (local_1d0 == (string *)0x0) {
      pcVar1 = local_2b0->Makefile;
      local_250 = (undefined1  [8])0x1a;
      auStack_248._0_8_ = "CMAKE_INCLUDE_SYSTEM_FLAG_";
      auStack_248._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_230 = (_Base_ptr)(local_2a8->_M_dataplus)._M_p;
      auStack_248._16_8_ = local_2a8->_M_string_length;
      local_228 = 0;
      views_01._M_len = 2;
      views_01._M_array = (iterator)local_250;
      cmCatViews(&local_2d8,views_01);
      local_270 = (string *)cmMakefile::GetDefinition(pcVar1,&local_2d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      pcVar1 = local_2b0->Makefile;
      local_250 = (undefined1  [8])0x1b;
      auStack_248._0_8_ = "_CMAKE_INCLUDE_SYSTEM_FLAG_";
      auStack_248._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_230 = (_Base_ptr)(local_2a8->_M_dataplus)._M_p;
      auStack_248._16_8_ = local_2a8->_M_string_length;
      local_228 = 0;
      local_220 = 8;
      local_218 = "_WARNING";
      local_210 = 0;
      views_02._M_len = 3;
      views_02._M_array = (iterator)local_250;
      cmCatViews(&local_2d8,views_02);
      local_278 = (string *)cmMakefile::GetDefinition(pcVar1,&local_2d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)local_298);
      local_278 = (string *)0x0;
      local_270 = (string *)0x0;
    }
    pcVar1 = local_2b0->Makefile;
    local_250 = (undefined1  [8])0x6;
    auStack_248._0_8_ = "CMAKE_";
    auStack_248._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_230 = (_Base_ptr)(local_2a8->_M_dataplus)._M_p;
    auStack_248._16_8_ = local_2a8->_M_string_length;
    local_228 = 0;
    local_220 = 0x16;
    local_218 = "_FRAMEWORK_SEARCH_FLAG";
    local_210 = 0;
    views_03._M_len = 3;
    views_03._M_array = (iterator)local_250;
    cmCatViews(&local_2d8,views_03);
    cVar5 = cmMakefile::GetDefinition(pcVar1,&local_2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = local_2b0->Makefile;
    local_250 = (undefined1  [8])0x6;
    auStack_248._0_8_ = "CMAKE_";
    auStack_248._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_230 = (_Base_ptr)(local_2a8->_M_dataplus)._M_p;
    auStack_248._16_8_ = local_2a8->_M_string_length;
    local_228 = 0;
    local_220 = 0x1d;
    local_218 = "_SYSTEM_FRAMEWORK_SEARCH_FLAG";
    local_210 = 0;
    views_04._M_len = 3;
    views_04._M_array = (iterator)local_250;
    cmCatViews(&local_2d8,views_04);
    cVar6 = cmMakefile::GetDefinition(pcVar1,&local_2d8);
    local_1e0 = __return_storage_ptr__;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    auStack_248._16_8_ = auStack_248;
    auStack_248._0_8_ = auStack_248._0_8_ & 0xffffffff00000000;
    auStack_248._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_228 = 0;
    local_1c8 = local_1c0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_230 = (_Base_ptr)auStack_248._16_8_;
    if (local_1c0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1c0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_29c = (uint)forResponseFile * 2;
      local_2b2 = cVar6.Value != (string *)0x0 && this_00 != (cmGeneratorTarget *)0x0;
      local_2b1 = local_270 != (string *)0x0 && this_00 != (cmGeneratorTarget *)0x0;
      bVar2 = 0;
      local_2a0 = 0;
      pbVar8 = local_1c0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_1e8 = cVar6.Value;
      do {
        if ((cVar5.Value == (string *)0x0) || ((cVar5.Value)->_M_string_length == 0)) {
LAB_0034c61b:
          if (!(bool)(local_1d0 != (string *)0x0 & bVar2)) {
            if ((local_2b1 == '\0') ||
               (bVar3 = cmGeneratorTarget::IsSystemIncludeDirectory
                                  (this_00,pbVar8,local_268,local_2a8), !bVar3)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(local_1d8->_M_dataplus)._M_p,
                         local_1d8->_M_string_length);
            }
            else {
              local_2a0 = (undefined4)CONCAT71((int7)((ulong)local_270 >> 8),1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(local_270->_M_dataplus)._M_p,
                         local_270->_M_string_length);
            }
          }
          (*(local_2b0->super_cmOutputConverter)._vptr_cmOutputConverter[0x13])
                    (&local_2d8,local_2b0,pbVar8,(ulong)local_29c);
          if ((local_2d8._M_string_length != 0 && local_258 != (string *)0x0) &&
             (*local_2d8._M_dataplus._M_p != '\"')) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
          if (((local_258 != (string *)0x0) && (local_2d8._M_string_length != 0)) &&
             (*local_2d8._M_dataplus._M_p != '\"')) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)local_298._0_8_,local_298._8_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
          }
          bVar2 = 1;
        }
        else {
          pcVar1 = local_2b0->Makefile;
          local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"APPLE","");
          bVar3 = cmMakefile::IsOn(pcVar1,&local_2d8);
          if (bVar3) {
            bVar3 = cmSystemTools::IsPathToFramework(pbVar8);
          }
          else {
            bVar3 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
          }
          this_00 = local_260;
          if (bVar3 == false) goto LAB_0034c61b;
          cmsys::SystemTools::GetFilenamePath(&local_2d8,pbVar8);
          pVar9 = std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)local_250,&local_2d8);
          if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            if ((local_2b2 == '\0') ||
               (bVar3 = cmGeneratorTarget::IsSystemIncludeDirectory
                                  (this_00,&local_2d8,local_268,local_2a8), cVar6.Value = local_1e8,
               !bVar3)) {
              cVar6 = cVar5;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,((cVar6.Value)->_M_dataplus)._M_p,
                       (cVar6.Value)->_M_string_length);
            source._M_str = local_2d8._M_dataplus._M_p;
            source._M_len = local_2d8._M_string_length;
            cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                      (&local_208,&local_2b0->super_cmOutputConverter,source,local_29c,false);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_208._M_dataplus._M_p,
                                local_208._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
          }
        }
        pbVar8 = pbVar8 + 1;
      } while (pbVar8 != local_1c8);
      if (((byte)local_2a0 & local_278 != (string *)0x0) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(local_278->_M_dataplus)._M_p,local_278->_M_string_length);
      }
    }
    std::__cxx11::stringbuf::str();
    __return_storage_ptr__ = local_1e0;
    if (((*(char *)local_298._0_8_ != ' ') && (local_2d8._M_string_length != 0)) &&
       (local_2d8._M_dataplus._M_p[local_2d8._M_string_length - 1] == *(char *)local_298._0_8_)) {
      local_2d8._M_dataplus._M_p[local_2d8._M_string_length - 1] = ' ';
    }
    str._M_str = local_2d8._M_dataplus._M_p;
    str._M_len = local_2d8._M_string_length;
    cmTrimWhitespace_abi_cxx11_(local_1e0,str);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_250);
    if ((cmGeneratorTarget *)local_298._0_8_ != (cmGeneratorTarget *)(local_298 + 0x10)) {
      operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1c0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetIncludeFlags(
  std::vector<std::string> const& includeDirs, cmGeneratorTarget* target,
  std::string const& lang, std::string const& config, bool forResponseFile)
{
  if (lang.empty()) {
    return "";
  }

  std::vector<std::string> includes = includeDirs;
  MoveSystemIncludesToEnd(includes, config, lang, target);

  OutputFormat shellFormat = forResponseFile ? RESPONSE : SHELL;
  std::ostringstream includeFlags;

  std::string const& includeFlag =
    this->Makefile->GetSafeDefinition(cmStrCat("CMAKE_INCLUDE_FLAG_", lang));
  bool quotePaths = false;
  if (this->Makefile->GetDefinition("CMAKE_QUOTE_INCLUDE_PATHS")) {
    quotePaths = true;
  }
  std::string sep = " ";
  bool repeatFlag = true;
  // should the include flag be repeated like ie. -IA -IB
  if (cmValue incSep = this->Makefile->GetDefinition(
        cmStrCat("CMAKE_INCLUDE_FLAG_SEP_", lang))) {
    // if there is a separator then the flag is not repeated but is only
    // given once i.e.  -classpath a:b:c
    sep = *incSep;
    repeatFlag = false;
  }

  // Support special system include flag if it is available and the
  // normal flag is repeated for each directory.
  cmValue sysIncludeFlag = nullptr;
  cmValue sysIncludeFlagWarning = nullptr;
  if (repeatFlag) {
    sysIncludeFlag = this->Makefile->GetDefinition(
      cmStrCat("CMAKE_INCLUDE_SYSTEM_FLAG_", lang));
    sysIncludeFlagWarning = this->Makefile->GetDefinition(
      cmStrCat("_CMAKE_INCLUDE_SYSTEM_FLAG_", lang, "_WARNING"));
  }

  cmValue fwSearchFlag = this->Makefile->GetDefinition(
    cmStrCat("CMAKE_", lang, "_FRAMEWORK_SEARCH_FLAG"));
  cmValue sysFwSearchFlag = this->Makefile->GetDefinition(
    cmStrCat("CMAKE_", lang, "_SYSTEM_FRAMEWORK_SEARCH_FLAG"));

  bool flagUsed = false;
  bool sysIncludeFlagUsed = false;
  std::set<std::string> emitted;
#ifdef __APPLE__
  emitted.insert("/System/Library/Frameworks");
#endif
  for (std::string const& i : includes) {
    if (cmNonempty(fwSearchFlag) && this->Makefile->IsOn("APPLE") &&
        cmSystemTools::IsPathToFramework(i)) {
      std::string const frameworkDir = cmSystemTools::GetFilenamePath(i);
      if (emitted.insert(frameworkDir).second) {
        if (sysFwSearchFlag && target &&
            target->IsSystemIncludeDirectory(frameworkDir, config, lang)) {
          includeFlags << *sysFwSearchFlag;
        } else {
          includeFlags << *fwSearchFlag;
        }
        includeFlags << this->ConvertToOutputFormat(frameworkDir, shellFormat)
                     << " ";
      }
      continue;
    }

    if (!flagUsed || repeatFlag) {
      if (sysIncludeFlag && target &&
          target->IsSystemIncludeDirectory(i, config, lang)) {
        includeFlags << *sysIncludeFlag;
        sysIncludeFlagUsed = true;
      } else {
        includeFlags << includeFlag;
      }
      flagUsed = true;
    }
    std::string includePath = this->ConvertToIncludeReference(i, shellFormat);
    if (quotePaths && !includePath.empty() && includePath.front() != '\"') {
      includeFlags << "\"";
    }
    includeFlags << includePath;
    if (quotePaths && !includePath.empty() && includePath.front() != '\"') {
      includeFlags << "\"";
    }
    includeFlags << sep;
  }
  if (sysIncludeFlagUsed && sysIncludeFlagWarning) {
    includeFlags << *sysIncludeFlagWarning;
  }
  std::string flags = includeFlags.str();
  // remove trailing separators
  if ((sep[0] != ' ') && !flags.empty() && flags.back() == sep[0]) {
    flags.back() = ' ';
  }
  return cmTrimWhitespace(flags);
}